

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonArray.cpp
# Opt level: O0

void __thiscall Json::JsonArray::__toList(JsonArray *this)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference psVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  allocator<char> local_e1;
  value_type local_e0;
  allocator<char> local_b9;
  value_type local_b8;
  reference local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  shared_ptr<Json::JsonValue> jsonValue;
  iterator __end1;
  iterator __begin1;
  json_array_vector_pair_t *__range1;
  int local_48;
  int __size;
  int __index;
  allocator<char> local_31;
  value_type local_30;
  JsonArray *local_10;
  JsonArray *this_local;
  
  local_10 = this;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->__lstJsonText);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,1,'[',&local_31);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->__lstJsonText,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  local_48 = 0;
  sVar3 = std::
          vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
          ::size(&this->__lstJsonArray);
  __end1 = std::
           vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
           ::begin(&this->__lstJsonArray);
  jsonValue.super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>
       ::end(&this->__lstJsonArray);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
                                *)&jsonValue.
                                   super___shared_ptr<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (!bVar1) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<Json::JsonValue>::shared_ptr((shared_ptr<Json::JsonValue> *)&__range2,psVar4);
    peVar5 = std::__shared_ptr_access<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Json::JsonValue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&__range2);
    iVar2 = (*peVar5->_vptr_JsonValue[10])();
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(extraout_var,iVar2));
    p = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(extraout_var,iVar2));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&p);
      if (!bVar1) break;
      local_98 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end2);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->__lstJsonText,local_98);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    local_48 = local_48 + 1;
    if (local_48 < (int)sVar3) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,1,',',&local_b9);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&this->__lstJsonText,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
    }
    std::shared_ptr<Json::JsonValue>::~shared_ptr((shared_ptr<Json::JsonValue> *)&__range2);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<Json::JsonValue>_*,_std::vector<std::shared_ptr<Json::JsonValue>,_std::allocator<std::shared_ptr<Json::JsonValue>_>_>_>
    ::operator++(&__end1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e0,1,']',&local_e1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->__lstJsonText,&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator(&local_e1);
  return;
}

Assistant:

void Json::JsonArray::__toList() {
    __lstJsonText.clear();
    __lstJsonText.push_back(_JSCS(JSON_ARRAY_BEGIN));
    int __index = 0, __size = __lstJsonArray.size();
    for (std::shared_ptr<JsonValue> jsonValue : __lstJsonArray) {
        for (auto &&p : jsonValue->toList()) __lstJsonText.push_back(p);
        __index++;
        if (__index < __size) __lstJsonText.push_back(_JSCS(JSON_SEPARATE));
    }
    __lstJsonText.push_back(_JSCS(JSON_ARRAY_END));
}